

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O1

unsigned_long
cfgfile::format_t<unsigned_long,_cfgfile::string_trait_t>::from_string
          (parser_info_t<cfgfile::string_trait_t> *info,string_t *value)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  ulong uVar3;
  exception_t<cfgfile::string_trait_t> *this;
  pos_t pos;
  undefined1 *local_230;
  long local_228;
  undefined1 local_220 [16];
  undefined1 *local_210;
  long local_208;
  undefined1 local_200 [16];
  undefined1 *local_1f0;
  long local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string_t local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __nptr = (value->_M_dataplus)._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  uVar3 = strtoul(__nptr,(char **)&local_130,10);
  if (local_130._M_dataplus._M_p == __nptr) {
    std::__throw_invalid_argument("stoul");
  }
  else if (*piVar2 != 0x22) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if ((long)local_130._M_dataplus._M_p - (long)__nptr == value->_M_string_length) {
      return uVar3;
    }
    goto LAB_001265b2;
  }
  std::__throw_out_of_range("stoul");
LAB_001265b2:
  this = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Invalid value: \"","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_150,local_1d0,local_1d0 + local_1c8);
  std::operator+(&local_f0,&local_150,value);
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"\". In file \"","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_170,local_1f0,local_1f0 + local_1e8);
  std::operator+(&local_d0,&local_f0,&local_170);
  std::operator+(&local_b0,&local_d0,&info->m_file_name);
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"\" on line ","");
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_190,local_210,local_210 + local_208);
  std::operator+(local_90,&local_b0,&local_190);
  string_trait_t::to_string_abi_cxx11_(&local_110,(string_trait_t *)info->m_line_number,pos);
  std::operator+(&local_130,local_90,&local_110);
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,".","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1b0,local_230,local_230 + local_228);
  std::operator+(&local_50,&local_130,&local_1b0);
  exception_t<cfgfile::string_trait_t>::exception_t(this,&local_50);
  __cxa_throw(this,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

static unsigned long from_string( const parser_info_t< string_trait_t > & info,
		const string_trait_t::string_t & value )
	{
		try {
			std::size_t pos = 0;

			unsigned long result = std::stoul( value, &pos );

			if( pos != value.length() )
				throw exception_t< string_trait_t >(
					string_trait_t::from_ascii( "Invalid value: \"" ) +
					value + string_trait_t::from_ascii( "\". In file \"" ) +
					info.file_name() +
					string_trait_t::from_ascii( "\" on line " ) +
					string_trait_t::to_string( info.line_number() ) +
					string_trait_t::from_ascii( "." ) );

			return result;
		}
		catch( const std::exception & )
		{
			throw exception_t< string_trait_t >(
				string_trait_t::from_ascii( "Invalid value: \"" ) +
				value + string_trait_t::from_ascii( "\". In file \"" ) +
				info.file_name() +
				string_trait_t::from_ascii( "\" on line " ) +
				string_trait_t::to_string( info.line_number() ) +
				string_trait_t::from_ascii( "." ) );
		}
	}